

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::OutputFile::breakScanLine(OutputFile *this,int y,int offset,int length,char c)

{
  long *plVar1;
  reference pvVar2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  stringstream _iex_throw_s;
  Int64 position;
  Lock lock;
  Lock *in_stack_fffffffffffffe00;
  Mutex *in_stack_fffffffffffffe08;
  Lock *in_stack_fffffffffffffe10;
  int local_1cc;
  stringstream local_1c8 [16];
  ostream local_1b8 [392];
  value_type local_30;
  undefined1 local_15;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0));
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      (*(long *)(in_RDI + 8) + 0x98),
                      (long)((local_c - *(int *)(*(long *)(in_RDI + 8) + 0x8c)) /
                            *(int *)(*(long *)(in_RDI + 8) + 0x120)));
  local_30 = *pvVar2;
  if (local_30 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar3 = std::operator<<(local_1b8,"Cannot overwrite scan line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3,". The scan line has not yet been stored in file \"");
    pcVar4 = fileName((OutputFile *)0x1394ed);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_1c8);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x30) = 0;
  plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_30 + (long)local_10);
  for (local_1cc = 0; local_1cc < local_14; local_1cc = local_1cc + 1) {
    plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28);
    (**(code **)(*plVar1 + 0x10))(plVar1,&local_15,1);
  }
  IlmThread_2_5::Lock::~Lock(in_stack_fffffffffffffe00);
  return;
}

Assistant:

void	
OutputFile::breakScanLine  (int y, int offset, int length, char c)
{
    Lock lock (*_data->_streamData);

    Int64 position = 
	_data->lineOffsets[(y - _data->minY) / _data->linesInBuffer];

    if (!position)
	THROW (IEX_NAMESPACE::ArgExc, "Cannot overwrite scan line " << y << ". "
			    "The scan line has not yet been stored in "
			    "file \"" << fileName() << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}